

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O2

size_t sse42_despace_branchless(char *bytes,size_t howmany)

{
  undefined1 (*pauVar1) [16];
  byte bVar2;
  undefined1 auVar3 [16];
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [16];
  
  auVar7._8_4_ = 0x200a0d20;
  auVar7._0_8_ = 0x200a0d20200a0d20;
  auVar7._12_4_ = 0x200a0d20;
  uVar5 = 0;
  sVar4 = 0;
  while (uVar5 + 0xf < howmany) {
    pauVar1 = (undefined1 (*) [16])(bytes + uVar5);
    uVar5 = uVar5 + 0x10;
    vpcmpestrm_avx(auVar7,*pauVar1,0);
    uVar6 = in_ZMM0._0_4_;
    auVar3 = vpshufb_avx(*pauVar1,*(undefined1 (*) [16])("" + ((uVar6 & 0x7fff) << 4)));
    in_ZMM0 = ZEXT1664(auVar3);
    *(undefined1 (*) [16])(bytes + sVar4) = auVar3;
    sVar4 = sVar4 + (long)(0x10 - POPCOUNT(uVar6));
  }
  for (; uVar5 < howmany; uVar5 = uVar5 + 1) {
    bVar2 = bytes[uVar5];
    if ((0x20 < (ulong)bVar2) || ((0x100002400U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) {
      bytes[sVar4] = bVar2;
      sVar4 = sVar4 + 1;
    }
  }
  return sVar4;
}

Assistant:

size_t sse42_despace_branchless(char *bytes, size_t howmany) {
  size_t pos = 0;
  __m128i targetchars =
      _mm_set_epi8(' ', '\n', '\r', ' ', ' ', '\n', '\r', ' ', ' ', '\n', '\r',
                   ' ', ' ', '\n', '\r', ' ');
  size_t i = 0;
  for (; i + 15 < howmany; i += 16) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    int mask16 = _mm_cvtsi128_si32(
        _mm_cmpestrm(targetchars, 3, x, 16,
                     _SIDD_UBYTE_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK));
    x = _mm_shuffle_epi8(
        x, _mm_loadu_si128((const __m128i *)despace_mask16 + (mask16 & 0x7fff)));
    _mm_storeu_si128((__m128i *)(bytes + pos), x);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}